

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

const_object_iterator __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
          (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this,string_view_type *key
          )

{
  object *this_00;
  const_iterator cVar1;
  not_an_object *this_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  const_object_iterator cVar2;
  const_object_range_type local_30;
  
  switch((byte)*this & 0xf) {
  case 4:
    object_range_abi_cxx11_(&local_30,this);
    cVar2._9_7_ = (int7)((ulong)extraout_RDX_00 >> 8);
    cVar2.has_value_ = local_30.last_.has_value_;
    cVar2.it_._M_current = local_30.last_.it_._M_current;
    break;
  default:
    this_01 = (not_an_object *)__cxa_allocate_exception(0x58);
    not_an_object::not_an_object<char>(this_01,key->_M_str,key->_M_len);
    __cxa_throw(this_01,&not_an_object::typeinfo,not_an_object::~not_an_object);
  case 8:
  case 9:
    cVar2 = find_abi_cxx11_(*(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> **)
                             (this + 8),key);
    break;
  case 0xd:
    this_00 = object_storage::value_abi_cxx11_((object_storage *)this);
    cVar1 = sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
            ::find(this_00,key);
    cVar2._9_7_ = (int7)((ulong)extraout_RDX >> 8);
    cVar2.has_value_ = true;
    cVar2.it_._M_current = cVar1._M_current;
  }
  return cVar2;
}

Assistant:

const_object_iterator find(const string_view_type& key) const
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                    return object_range().end();
                case json_storage_kind::object:
                    return const_object_iterator(cast<object_storage>().value().find(key));
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().find(key);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().find(key);
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }
        }